

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O3

int ipc_pipe_init(void *arg,nni_pipe *pipe)

{
  *(nni_pipe **)((long)arg + 0x28) = pipe;
  nni_mtx_init((nni_mtx *)((long)arg + 0x608));
  nni_aio_init((nni_aio *)((long)arg + 0xa8),ipc_pipe_send_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x270),ipc_pipe_recv_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x438),ipc_pipe_nego_cb,arg);
  nni_aio_list_init((nni_list *)((long)arg + 0x90));
  nni_aio_list_init((nni_list *)((long)arg + 0x78));
  return 0;
}

Assistant:

static int
ipc_pipe_init(void *arg, nni_pipe *pipe)
{
	ipc_pipe *p = arg;
	p->pipe     = pipe;
	nni_mtx_init(&p->mtx);
	nni_aio_init(&p->tx_aio, ipc_pipe_send_cb, p);
	nni_aio_init(&p->rx_aio, ipc_pipe_recv_cb, p);
	nni_aio_init(&p->neg_aio, ipc_pipe_nego_cb, p);
	nni_aio_list_init(&p->send_q);
	nni_aio_list_init(&p->recv_q);
	return (0);
}